

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QStyleSheetBorderData::QStyleSheetBorderData
          (QStyleSheetBorderData *this,int *b,QBrush *c,BorderStyle *s,QSize *r)

{
  QStyleSheetBorderImageData *pQVar1;
  long in_RCX;
  QStyleSheetBorderImageData *this_00;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int i;
  QStyleSheetBorderImageData *local_58;
  QBrush *local_38;
  int local_2c;
  
  QSharedData::QSharedData((QSharedData *)0x448df0);
  local_38 = (QBrush *)(in_RDI + 0x18);
  do {
    QBrush::QBrush(local_38);
    local_38 = local_38 + 8;
  } while (local_38 != (QBrush *)(in_RDI + 0x38));
  this_00 = (QStyleSheetBorderImageData *)(in_RDI + 0x68);
  pQVar1 = (QStyleSheetBorderImageData *)(in_RDI + 0x48);
  do {
    local_58 = pQVar1;
    QSize::QSize((QSize *)this_00);
    pQVar1 = (QStyleSheetBorderImageData *)(local_58->cuts + 1);
  } while ((QStyleSheetBorderImageData *)(local_58->cuts + 1) != this_00);
  QSharedDataPointer<QStyleSheetBorderImageData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBorderImageData> *)this_00,local_58);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    *(undefined4 *)(in_RDI + 4 + (long)local_2c * 4) = *(undefined4 *)(in_RSI + (long)local_2c * 4);
    *(undefined4 *)(in_RDI + 0x38 + (long)local_2c * 4) =
         *(undefined4 *)(in_RCX + (long)local_2c * 4);
    QBrush::operator=((QBrush *)(in_RDI + 0x18 + (long)local_2c * 8),
                      (QBrush *)(in_RDX + (long)local_2c * 8));
    *(undefined8 *)(in_RDI + 0x48 + (long)local_2c * 8) =
         *(undefined8 *)(in_R8 + (long)local_2c * 8);
  }
  return;
}

Assistant:

QStyleSheetBorderData(int *b, QBrush *c, QCss::BorderStyle *s, QSize *r) : bi(nullptr)
    {
        for (int i = 0; i < 4; i++) {
            borders[i] = b[i];
            styles[i] = s[i];
            colors[i] = c[i];
            radii[i] = r[i];
        }
    }